

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtmochelpers.h
# Opt level: O2

bool __thiscall
QtMocHelpers::indexOfMethod<void(QDBusPlatformMenu::*)(int,unsigned_int)>
          (QtMocHelpers *this,void **_a,offset_in_QDBusPlatformMenu_to_subr f,int index)

{
  void **ppvVar1;
  bool bVar2;
  
  ppvVar1 = (void **)**(long **)(this + 8);
  bVar2 = (*(long **)(this + 8))[1] == f;
  if ((bVar2 || ppvVar1 == (void **)0x0) && ppvVar1 == _a) {
    **(int **)this = index;
  }
  return (bVar2 || ppvVar1 == (void **)0x0) && ppvVar1 == _a;
}

Assistant:

inline bool indexOfMethod(void **_a, FuncType f, int index) noexcept
{
    int *result = static_cast<int *>(_a[0]);
    auto candidate = reinterpret_cast<FuncType *>(_a[1]);
    if (*candidate != f)
        return false;
    *result = index;
    return true;
}